

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O2

void __thiscall Fl_Pixmap::copy_data(Fl_Pixmap *this)

{
  int iVar1;
  uint uVar2;
  char **ppcVar3;
  int iVar4;
  int iVar5;
  char **ppcVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  char **ppcVar14;
  ulong __n;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  int ncolors;
  ulong local_50;
  ulong local_48;
  Fl_Pixmap *local_40;
  int chars_per_pixel;
  
  if (this->alloc_data == 0) {
    __isoc99_sscanf(*(this->super_Fl_Image).data_,"%*d%*d%d%d",&ncolors,&chars_per_pixel);
    iVar5 = ncolors;
    iVar1 = (this->super_Fl_Image).w_;
    local_50 = (ulong)ncolors;
    uVar2 = (this->super_Fl_Image).h_;
    local_48 = (ulong)uVar2;
    if ((long)local_50 < 0) {
      iVar11 = uVar2 + 2;
      bVar17 = SBORROW4(uVar2,-2);
      iVar4 = uVar2 + 2;
    }
    else {
      iVar11 = uVar2 + ncolors + 1;
      bVar17 = SBORROW4(uVar2 + ncolors,-1);
      iVar4 = uVar2 + ncolors + 1;
    }
    uVar9 = 0xffffffffffffffff;
    if (bVar17 == iVar4 < 0) {
      uVar9 = (long)iVar11 << 3;
    }
    ppcVar6 = (char **)operator_new__(uVar9);
    ppcVar3 = (this->super_Fl_Image).data_;
    pcVar10 = *ppcVar3;
    local_40 = this;
    sVar7 = strlen(pcVar10);
    pcVar8 = (char *)operator_new__(sVar7 + 1);
    *ppcVar6 = pcVar8;
    strcpy(pcVar8,pcVar10);
    if (iVar5 < 0) {
      ncolors = -iVar5;
      pcVar10 = (char *)operator_new__((ulong)(uint)(iVar5 * -4));
      ppcVar6[1] = pcVar10;
      memcpy(pcVar10,ppcVar3[1],(ulong)(uint)(iVar5 * -4));
      ncolors = 1;
      ppcVar14 = ppcVar6 + 2;
      local_50 = 1;
    }
    else {
      lVar15 = local_50 * 8;
      for (lVar12 = 0; lVar15 != lVar12; lVar12 = lVar12 + 8) {
        pcVar10 = *(char **)((long)ppcVar3 + lVar12 + 8);
        sVar7 = strlen(pcVar10);
        pcVar8 = (char *)operator_new__(sVar7 + 1);
        *(char **)((long)ppcVar6 + lVar12 + 8) = pcVar8;
        strcpy(pcVar8,pcVar10);
      }
      ppcVar14 = (char **)((long)ppcVar6 + lVar12 + 8);
    }
    __n = (long)iVar1 * (long)chars_per_pixel + 1;
    uVar9 = local_50 & 0xffffffff;
    uVar13 = 0;
    uVar16 = 0;
    if (0 < (int)local_48) {
      uVar16 = local_48 & 0xffffffff;
    }
    for (; uVar16 != uVar13; uVar13 = uVar13 + 1) {
      pcVar10 = (char *)operator_new__(__n);
      ppcVar14[uVar13] = pcVar10;
      memcpy(pcVar10,ppcVar3[uVar9 + uVar13 + 1],__n);
    }
    (local_40->super_Fl_Image).data_ = ppcVar6;
    (local_40->super_Fl_Image).count_ = (int)local_48 + (int)local_50 + 1;
    local_40->alloc_data = 1;
    return;
  }
  return;
}

Assistant:

void Fl_Pixmap::copy_data() {
  if (alloc_data) return;

  char		**new_data,	// New data array
		**new_row;	// Current row in image
  int		i,		// Looping var
		ncolors,	// Number of colors in image
		chars_per_pixel,// Characters per color
		chars_per_line;	// Characters per line

  // Figure out how many colors there are, and how big they are...
  sscanf(data()[0],"%*d%*d%d%d", &ncolors, &chars_per_pixel);
  chars_per_line = chars_per_pixel * w() + 1;

  // Allocate memory for the new array...
  if (ncolors < 0) new_data = new char *[h() + 2];
  else new_data = new char *[h() + ncolors + 1];

  new_data[0] = new char[strlen(data()[0]) + 1];
  strcpy(new_data[0], data()[0]);

  // Copy colors...
  if (ncolors < 0) {
    // Copy FLTK colormap values...
    ncolors = -ncolors;
    new_row = new_data + 1;
    *new_row = new char[ncolors * 4];
    memcpy(*new_row, data()[1], ncolors * 4);
    ncolors = 1;
    new_row ++;
  } else {
    // Copy standard XPM colormap values...
    for (i = 0, new_row = new_data + 1; i < ncolors; i ++, new_row ++) {
      *new_row = new char[strlen(data()[i + 1]) + 1];
      strcpy(*new_row, data()[i + 1]);
    }
  }

  // Copy image data...
  for (i = 0; i < h(); i ++, new_row ++) {
    *new_row = new char[chars_per_line];
    memcpy(*new_row, data()[i + ncolors + 1], chars_per_line);
  }

  // Update pointers...
  data((const char **)new_data, h() + ncolors + 1);
  alloc_data = 1;
}